

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtextedit.cpp
# Opt level: O0

void QTextEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QObject QVar2;
  int iVar3;
  LineWrapMode LVar4;
  TextInteractionFlags TVar5;
  QTextEdit *pQVar6;
  QTextDocument *pQVar7;
  QtMocHelpers *in_RCX;
  EVP_PKEY_CTX *in_RDX;
  int iVar8;
  EVP_PKEY_CTX *in_RSI;
  QColor *in_RDI;
  long in_FS_OFFSET;
  qreal qVar9;
  void *_v_1;
  void *_v;
  QTextEdit *_t;
  QVariant _r_1;
  QVariant _r;
  undefined4 in_stack_fffffffffffffe18;
  QFlagsStorage<QTextEdit::AutoFormattingFlag> in_stack_fffffffffffffe1c;
  QFont *in_stack_fffffffffffffe20;
  bool italic;
  QColor *in_stack_fffffffffffffe28;
  AutoFormatting features;
  QTextEdit *in_stack_fffffffffffffe30;
  QTextEdit *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  QTextEdit *in_stack_fffffffffffffe58;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  InputMethodQuery in_stack_ffffffffffffff0c;
  QTextEdit *in_stack_ffffffffffffff10;
  QVariant local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *local_30;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar8 = (int)in_RSI;
  if (iVar8 == 0) {
    pQVar6 = (QTextEdit *)((ulong)in_RDX & 0xffffffff);
    bVar1 = SUB41(in_stack_fffffffffffffe1c.i >> 0x18,0);
    italic = SUB81((ulong)in_stack_fffffffffffffe20 >> 0x38,0);
    switch(pQVar6) {
    case (QTextEdit *)0x0:
      textChanged((QTextEdit *)0x6d6521);
      break;
    case (QTextEdit *)0x1:
      undoAvailable((QTextEdit *)0x6d6546,bVar1);
      break;
    case (QTextEdit *)0x2:
      redoAvailable((QTextEdit *)0x6d656b,bVar1);
      break;
    case (QTextEdit *)0x3:
      currentCharFormatChanged
                ((QTextEdit *)in_stack_fffffffffffffe20,
                 (QTextCharFormat *)CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18))
      ;
      break;
    case (QTextEdit *)0x4:
      copyAvailable((QTextEdit *)0x6d65ae,bVar1);
      break;
    case (QTextEdit *)0x5:
      selectionChanged((QTextEdit *)0x6d65c0);
      break;
    case (QTextEdit *)0x6:
      cursorPositionChanged((QTextEdit *)0x6d65d2);
      break;
    case (QTextEdit *)0x7:
      setFontPointSize((QTextEdit *)in_stack_fffffffffffffe28,(qreal)in_stack_fffffffffffffe20);
      break;
    case (QTextEdit *)0x8:
      setFontFamily(in_stack_fffffffffffffe58,(QString *)pQVar6);
      break;
    case (QTextEdit *)0x9:
      setFontWeight((QTextEdit *)in_stack_fffffffffffffe28,
                    (int)((ulong)in_stack_fffffffffffffe20 >> 0x20));
      break;
    case (QTextEdit *)0xa:
      setFontUnderline((QTextEdit *)in_stack_fffffffffffffe28,italic);
      break;
    case (QTextEdit *)0xb:
      setFontItalic((QTextEdit *)in_stack_fffffffffffffe28,italic);
      break;
    case (QTextEdit *)0xc:
      setTextColor(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      break;
    case (QTextEdit *)0xd:
      setTextBackgroundColor(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      break;
    case (QTextEdit *)0xe:
      setCurrentFont((QTextEdit *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      break;
    case (QTextEdit *)0xf:
      setAlignment((QTextEdit *)in_stack_fffffffffffffe28,
                   (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                   SUB84((ulong)in_stack_fffffffffffffe38 >> 0x20,0));
      break;
    case (QTextEdit *)0x10:
      setPlainText((QTextEdit *)in_stack_fffffffffffffe20,
                   (QString *)CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
      break;
    case (QTextEdit *)0x11:
      setHtml((QTextEdit *)in_stack_fffffffffffffe20,
              (QString *)CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
      break;
    case (QTextEdit *)0x12:
      setMarkdown((QTextEdit *)in_stack_fffffffffffffe20,
                  (QString *)CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
      break;
    case (QTextEdit *)0x13:
      setText((QTextEdit *)in_stack_fffffffffffffe28,(QString *)in_stack_fffffffffffffe20);
      break;
    case (QTextEdit *)0x14:
      cut((QTextEdit *)in_stack_fffffffffffffe20);
      break;
    case (QTextEdit *)0x15:
      copy((QTextEdit *)in_RDI,in_RSI,in_RDX);
      break;
    case (QTextEdit *)0x16:
      paste((QTextEdit *)in_stack_fffffffffffffe20);
      break;
    case (QTextEdit *)0x17:
      undo((QTextEdit *)in_stack_fffffffffffffe20);
      break;
    case (QTextEdit *)0x18:
      redo((QTextEdit *)in_stack_fffffffffffffe20);
      break;
    case (QTextEdit *)0x19:
      clear((QTextEdit *)in_stack_fffffffffffffe20);
      break;
    case (QTextEdit *)0x1a:
      selectAll((QTextEdit *)in_stack_fffffffffffffe20);
      break;
    case (QTextEdit *)0x1b:
      insertPlainText((QTextEdit *)in_stack_fffffffffffffe20,
                      (QString *)CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
      break;
    case (QTextEdit *)0x1c:
      insertHtml((QTextEdit *)in_stack_fffffffffffffe20,
                 (QString *)CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
      break;
    case (QTextEdit *)0x1d:
      append(pQVar6,(QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      break;
    case (QTextEdit *)0x1e:
      scrollToAnchor(in_stack_fffffffffffffe38,(QString *)in_stack_fffffffffffffe30);
      break;
    case (QTextEdit *)0x1f:
      zoomIn((QTextEdit *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c.i);
      break;
    case (QTextEdit *)0x20:
      zoomIn((QTextEdit *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c.i);
      break;
    case (QTextEdit *)0x21:
      zoomOut((QTextEdit *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c.i);
      break;
    case (QTextEdit *)0x22:
      zoomOut((QTextEdit *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c.i);
      break;
    case (QTextEdit *)0x23:
      local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*(long *)in_RDI + 0x1c8))(&local_28,in_RDI,**(undefined4 **)(in_RCX + 8));
      if (*(long *)in_RCX != 0) {
        ::QVariant::operator=
                  ((QVariant *)in_stack_fffffffffffffe28,(QVariant *)in_stack_fffffffffffffe20);
      }
      ::QVariant::~QVariant((QVariant *)&local_28);
      break;
    case (QTextEdit *)0x24:
      local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::QVariant(&local_68,*(QVariant **)(in_RCX + 0x10));
      inputMethodQuery(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                       (QVariant *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      ::QVariant::~QVariant(&local_68);
      if (*(long *)in_RCX != 0) {
        ::QVariant::operator=
                  ((QVariant *)in_stack_fffffffffffffe28,(QVariant *)in_stack_fffffffffffffe20);
      }
      ::QVariant::~QVariant((QVariant *)&local_48);
    }
  }
  if ((iVar8 != 5) ||
     ((((bVar1 = QtMocHelpers::indexOfMethod<void(QTextEdit::*)()>(in_RCX,(void **)textChanged,0,0),
        !bVar1 && (bVar1 = QtMocHelpers::indexOfMethod<void(QTextEdit::*)(bool)>
                                     (in_RCX,(void **)undoAvailable,0,1), !bVar1)) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QTextEdit::*)(bool)>
                          (in_RCX,(void **)redoAvailable,0,2), !bVar1)) &&
      (((bVar1 = QtMocHelpers::indexOfMethod<void(QTextEdit::*)(QTextCharFormat_const&)>
                           (in_RCX,(void **)currentCharFormatChanged,0,3), !bVar1 &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QTextEdit::*)(bool)>
                           (in_RCX,(void **)copyAvailable,0,4), !bVar1)) &&
       ((bVar1 = QtMocHelpers::indexOfMethod<void(QTextEdit::*)()>
                           (in_RCX,(void **)selectionChanged,0,5), !bVar1 &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QTextEdit::*)()>
                           (in_RCX,(void **)cursorPositionChanged,0,6), !bVar1)))))))) {
    if (iVar8 == 6) {
      if ((int)in_RDX == 0xf) {
        iVar3 = qRegisterMetaType<QTextDocument*>();
        **(int **)in_RCX = iVar3;
      }
      else {
        **(undefined4 **)in_RCX = 0xffffffff;
      }
    }
    if (iVar8 == 1) {
      pQVar6 = *(QTextEdit **)in_RCX;
      in_stack_fffffffffffffe38 = (QTextEdit *)((ulong)in_RDX & 0xffffffff);
      switch(in_stack_fffffffffffffe38) {
      case (QTextEdit *)0x0:
        autoFormatting((QTextEdit *)in_stack_fffffffffffffe20);
        QtMocHelpers::assignFlags<QFlags<QTextEdit::AutoFormattingFlag>>
                  ((void *)0x6d6cff,
                   (QFlags<QTextEdit::AutoFormattingFlag>)in_stack_fffffffffffffe1c.i);
        in_stack_fffffffffffffe30 = pQVar6;
        break;
      case (QTextEdit *)0x1:
        QVar2 = (QObject)tabChangesFocus((QTextEdit *)in_stack_fffffffffffffe20);
        (pQVar6->super_QAbstractScrollArea).super_QFrame.super_QWidget.super_QObject = QVar2;
        break;
      case (QTextEdit *)0x2:
        documentTitle((QTextEdit *)in_stack_fffffffffffffe28);
        QString::operator=((QString *)in_stack_fffffffffffffe20,
                           (QString *)
                           CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
        QString::~QString((QString *)0x6d6d56);
        break;
      case (QTextEdit *)0x3:
        QVar2 = (QObject)isUndoRedoEnabled((QTextEdit *)0x6d6d68);
        (pQVar6->super_QAbstractScrollArea).super_QFrame.super_QWidget.super_QObject = QVar2;
        break;
      case (QTextEdit *)0x4:
        LVar4 = lineWrapMode((QTextEdit *)in_stack_fffffffffffffe20);
        *(LineWrapMode *)&(pQVar6->super_QAbstractScrollArea).super_QFrame.super_QWidget = LVar4;
        break;
      case (QTextEdit *)0x5:
        iVar3 = lineWrapColumnOrWidth((QTextEdit *)in_stack_fffffffffffffe20);
        *(int *)&(pQVar6->super_QAbstractScrollArea).super_QFrame.super_QWidget = iVar3;
        break;
      case (QTextEdit *)0x6:
        QVar2 = (QObject)isReadOnly((QTextEdit *)in_stack_fffffffffffffe20);
        (pQVar6->super_QAbstractScrollArea).super_QFrame.super_QWidget.super_QObject = QVar2;
        break;
      case (QTextEdit *)0x7:
        QFlags<QTextDocument::MarkdownFeature>::QFlags
                  ((QFlags<QTextDocument::MarkdownFeature> *)in_stack_fffffffffffffe20,
                   in_stack_fffffffffffffe1c.i);
        toMarkdown((QTextEdit *)in_RDI,
                   (QFlagsStorageHelper<QTextDocument::MarkdownFeature,_4>)
                   SUB84((ulong)in_stack_fffffffffffffe38 >> 0x20,0));
        QString::operator=((QString *)in_stack_fffffffffffffe20,
                           (QString *)
                           CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
        QString::~QString((QString *)0x6d6e24);
        in_stack_fffffffffffffe28 = in_RDI;
        break;
      case (QTextEdit *)0x8:
        toHtml((QTextEdit *)in_stack_fffffffffffffe28);
        QString::operator=((QString *)in_stack_fffffffffffffe20,
                           (QString *)
                           CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
        QString::~QString((QString *)0x6d6e5d);
        break;
      case (QTextEdit *)0x9:
        toPlainText((QTextEdit *)in_stack_fffffffffffffe28);
        QString::operator=((QString *)in_stack_fffffffffffffe20,
                           (QString *)
                           CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
        QString::~QString((QString *)0x6d6e96);
        break;
      case (QTextEdit *)0xa:
        QVar2 = (QObject)overwriteMode((QTextEdit *)in_stack_fffffffffffffe20);
        (pQVar6->super_QAbstractScrollArea).super_QFrame.super_QWidget.super_QObject = QVar2;
        break;
      case (QTextEdit *)0xb:
        qVar9 = tabStopDistance(in_stack_fffffffffffffe30);
        *(qreal *)&(pQVar6->super_QAbstractScrollArea).super_QFrame.super_QWidget = qVar9;
        break;
      case (QTextEdit *)0xc:
        QVar2 = (QObject)acceptRichText((QTextEdit *)in_stack_fffffffffffffe20);
        (pQVar6->super_QAbstractScrollArea).super_QFrame.super_QWidget.super_QObject = QVar2;
        break;
      case (QTextEdit *)0xd:
        iVar3 = cursorWidth((QTextEdit *)in_stack_fffffffffffffe20);
        *(int *)&(pQVar6->super_QAbstractScrollArea).super_QFrame.super_QWidget = iVar3;
        break;
      case (QTextEdit *)0xe:
        TVar5 = textInteractionFlags
                          ((QTextEdit *)
                           CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
        *(QFlagsStorageHelper<Qt::TextInteractionFlag,_4> *)
         &(pQVar6->super_QAbstractScrollArea).super_QFrame.super_QWidget =
             TVar5.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
             super_QFlagsStorage<Qt::TextInteractionFlag>.i;
        break;
      case (QTextEdit *)0xf:
        pQVar7 = document((QTextEdit *)in_stack_fffffffffffffe20);
        *(QTextDocument **)&(pQVar6->super_QAbstractScrollArea).super_QFrame.super_QWidget = pQVar7;
        break;
      case (QTextEdit *)0x10:
        placeholderText((QTextEdit *)in_stack_fffffffffffffe28);
        QString::operator=((QString *)in_stack_fffffffffffffe20,
                           (QString *)
                           CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
        QString::~QString((QString *)0x6d6f7c);
      }
    }
    if (iVar8 == 2) {
      pQVar6 = (QTextEdit *)((ulong)in_RDX & 0xffffffff);
      features.super_QFlagsStorageHelper<QTextEdit::AutoFormattingFlag,_4>.
      super_QFlagsStorage<QTextEdit::AutoFormattingFlag>.i =
           SUB84((ulong)in_stack_fffffffffffffe28 >> 0x20,0);
      bVar1 = SUB41(in_stack_fffffffffffffe1c.i >> 0x18,0);
      switch(pQVar6) {
      case (QTextEdit *)0x0:
        setAutoFormatting(pQVar6,features);
        break;
      case (QTextEdit *)0x1:
        setTabChangesFocus(pQVar6,bVar1);
        break;
      case (QTextEdit *)0x2:
        setDocumentTitle(pQVar6,(QString *)
                                CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
        break;
      case (QTextEdit *)0x3:
        setUndoRedoEnabled(pQVar6,bVar1);
        break;
      case (QTextEdit *)0x4:
        setLineWrapMode(pQVar6,in_stack_fffffffffffffe1c.i);
        break;
      case (QTextEdit *)0x5:
        setLineWrapColumnOrWidth(pQVar6,in_stack_fffffffffffffe1c.i);
        break;
      case (QTextEdit *)0x6:
        setReadOnly(in_stack_fffffffffffffe38,SUB81((ulong)in_stack_fffffffffffffe30 >> 0x38,0));
        break;
      case (QTextEdit *)0x7:
        setMarkdown(pQVar6,(QString *)
                           CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
        break;
      case (QTextEdit *)0x8:
        setHtml(pQVar6,(QString *)CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
        break;
      case (QTextEdit *)0x9:
        setPlainText(pQVar6,(QString *)
                            CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
        break;
      case (QTextEdit *)0xa:
        setOverwriteMode(pQVar6,bVar1);
        break;
      case (QTextEdit *)0xb:
        setTabStopDistance(in_stack_fffffffffffffe30,(qreal)in_stack_fffffffffffffe28);
        break;
      case (QTextEdit *)0xc:
        setAcceptRichText(pQVar6,bVar1);
        break;
      case (QTextEdit *)0xd:
        setCursorWidth(pQVar6,in_stack_fffffffffffffe1c.i);
        break;
      case (QTextEdit *)0xe:
        setTextInteractionFlags
                  (pQVar6,(TextInteractionFlags)
                          features.super_QFlagsStorageHelper<QTextEdit::AutoFormattingFlag,_4>.
                          super_QFlagsStorage<QTextEdit::AutoFormattingFlag>.i);
        break;
      case (QTextEdit *)0xf:
        setDocument(pQVar6,(QTextDocument *)
                           CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
        break;
      case (QTextEdit *)0x10:
        setPlaceholderText(pQVar6,(QString *)
                                  CONCAT44(in_stack_fffffffffffffe1c.i,in_stack_fffffffffffffe18));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTextEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->textChanged(); break;
        case 1: _t->undoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 2: _t->redoAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->currentCharFormatChanged((*reinterpret_cast< std::add_pointer_t<QTextCharFormat>>(_a[1]))); break;
        case 4: _t->copyAvailable((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->selectionChanged(); break;
        case 6: _t->cursorPositionChanged(); break;
        case 7: _t->setFontPointSize((*reinterpret_cast< std::add_pointer_t<qreal>>(_a[1]))); break;
        case 8: _t->setFontFamily((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->setFontWeight((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 10: _t->setFontUnderline((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 11: _t->setFontItalic((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 12: _t->setTextColor((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        case 13: _t->setTextBackgroundColor((*reinterpret_cast< std::add_pointer_t<QColor>>(_a[1]))); break;
        case 14: _t->setCurrentFont((*reinterpret_cast< std::add_pointer_t<QFont>>(_a[1]))); break;
        case 15: _t->setAlignment((*reinterpret_cast< std::add_pointer_t<Qt::Alignment>>(_a[1]))); break;
        case 16: _t->setPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 17: _t->setHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 18: _t->setMarkdown((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 19: _t->setText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 20: _t->cut(); break;
        case 21: _t->copy(); break;
        case 22: _t->paste(); break;
        case 23: _t->undo(); break;
        case 24: _t->redo(); break;
        case 25: _t->clear(); break;
        case 26: _t->selectAll(); break;
        case 27: _t->insertPlainText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 28: _t->insertHtml((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 29: _t->append((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 30: _t->scrollToAnchor((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 31: _t->zoomIn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 32: _t->zoomIn(); break;
        case 33: _t->zoomOut((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 34: _t->zoomOut(); break;
        case 35: { QVariant _r = _t->loadResource((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        case 36: { QVariant _r = _t->inputMethodQuery((*reinterpret_cast< std::add_pointer_t<Qt::InputMethodQuery>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QVariant>>(_a[2])));
            if (_a[0]) *reinterpret_cast< QVariant*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)()>(_a, &QTextEdit::textChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)(bool )>(_a, &QTextEdit::undoAvailable, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)(bool )>(_a, &QTextEdit::redoAvailable, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)(const QTextCharFormat & )>(_a, &QTextEdit::currentCharFormatChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)(bool )>(_a, &QTextEdit::copyAvailable, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)()>(_a, &QTextEdit::selectionChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTextEdit::*)()>(_a, &QTextEdit::cursorPositionChanged, 6))
            return;
    }
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 15:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QTextDocument* >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: QtMocHelpers::assignFlags<AutoFormatting>(_v, _t->autoFormatting()); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->tabChangesFocus(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->documentTitle(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isUndoRedoEnabled(); break;
        case 4: *reinterpret_cast<LineWrapMode*>(_v) = _t->lineWrapMode(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->lineWrapColumnOrWidth(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 7: *reinterpret_cast<QString*>(_v) = _t->toMarkdown(); break;
        case 8: *reinterpret_cast<QString*>(_v) = _t->toHtml(); break;
        case 9: *reinterpret_cast<QString*>(_v) = _t->toPlainText(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->overwriteMode(); break;
        case 11: *reinterpret_cast<qreal*>(_v) = _t->tabStopDistance(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->acceptRichText(); break;
        case 13: *reinterpret_cast<int*>(_v) = _t->cursorWidth(); break;
        case 14: *reinterpret_cast<Qt::TextInteractionFlags*>(_v) = _t->textInteractionFlags(); break;
        case 15: *reinterpret_cast<QTextDocument**>(_v) = _t->document(); break;
        case 16: *reinterpret_cast<QString*>(_v) = _t->placeholderText(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setAutoFormatting(*reinterpret_cast<AutoFormatting*>(_v)); break;
        case 1: _t->setTabChangesFocus(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setDocumentTitle(*reinterpret_cast<QString*>(_v)); break;
        case 3: _t->setUndoRedoEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setLineWrapMode(*reinterpret_cast<LineWrapMode*>(_v)); break;
        case 5: _t->setLineWrapColumnOrWidth(*reinterpret_cast<int*>(_v)); break;
        case 6: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setMarkdown(*reinterpret_cast<QString*>(_v)); break;
        case 8: _t->setHtml(*reinterpret_cast<QString*>(_v)); break;
        case 9: _t->setPlainText(*reinterpret_cast<QString*>(_v)); break;
        case 10: _t->setOverwriteMode(*reinterpret_cast<bool*>(_v)); break;
        case 11: _t->setTabStopDistance(*reinterpret_cast<qreal*>(_v)); break;
        case 12: _t->setAcceptRichText(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setCursorWidth(*reinterpret_cast<int*>(_v)); break;
        case 14: _t->setTextInteractionFlags(*reinterpret_cast<Qt::TextInteractionFlags*>(_v)); break;
        case 15: _t->setDocument(*reinterpret_cast<QTextDocument**>(_v)); break;
        case 16: _t->setPlaceholderText(*reinterpret_cast<QString*>(_v)); break;
        default: break;
        }
    }
}